

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::Exists(Am_Value *this)

{
  Am_ID_Tag AVar1;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0) {
    if (this->type == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else if (AVar1 == 0x1000) {
    this_local._7_1_ = false;
  }
  else if ((AVar1 == 0x2000) || (AVar1 == 0x4000)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::Exists() const
{
  switch (Am_Type_Class(type)) {
  case Am_ERROR_VALUE_TYPE:
    return false;
  case Am_WRAPPER:
  case Am_ENUM:
    return true;
  case Am_SIMPLE_TYPE:
    switch (type) {
    case Am_NONE:
      return false;
    default:
      return true;
    }
  default:
    return true;
  }
}